

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-encoder.c
# Opt level: O1

int mg_session_write_float(mg_session *session,double value)

{
  int iVar1;
  char local_19;
  double local_18;
  ulong local_10;
  
  local_19 = -0x3f;
  local_18 = value;
  iVar1 = mg_session_write_raw(session,&local_19,1);
  if (iVar1 == 0) {
    local_10 = (ulong)local_18 >> 0x38 | ((ulong)local_18 & 0xff000000000000) >> 0x28 |
               ((ulong)local_18 & 0xff0000000000) >> 0x18 | ((ulong)local_18 & 0xff00000000) >> 8 |
               ((ulong)local_18 & 0xff000000) << 8 | ((ulong)local_18 & 0xff0000) << 0x18 |
               ((ulong)local_18 & 0xff00) << 0x28 | (long)local_18 << 0x38;
    iVar1 = mg_session_write_raw(session,(char *)&local_10,8);
  }
  return iVar1;
}

Assistant:

int mg_session_write_float(mg_session *session, double value) {
  MG_RETURN_IF_FAILED(mg_session_write_uint8(session, MG_MARKER_FLOAT));
  uint64_t as_uint64;
  memcpy(&as_uint64, &value, sizeof(value));
  return mg_session_write_uint64(session, as_uint64);
}